

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::BrepLoop> __thiscall
anurbs::Model::add<anurbs::BrepLoop>(Model *this,Pointer<anurbs::BrepLoop> *data)

{
  bool bVar1;
  invalid_argument *this_00;
  size_type sVar2;
  shared_ptr<anurbs::BrepLoop> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepLoop> RVar3;
  shared_ptr<anurbs::Entry<anurbs::BrepLoop>_> local_80;
  value_type_conflict1 local_70;
  shared_ptr<anurbs::Entry<anurbs::BrepLoop>_> local_68;
  shared_ptr<anurbs::BrepLoop> local_58;
  unique_ptr<anurbs::Entry<anurbs::BrepLoop>,_std::default_delete<anurbs::Entry<anurbs::BrepLoop>_>_>
  local_48;
  undefined1 local_40 [8];
  Pointer<Entry<BrepLoop>_> entry;
  Pointer<anurbs::BrepLoop> *data_local;
  Model *this_local;
  
  bVar1 = std::operator==(in_RDX,(nullptr_t)0x0);
  if (!bVar1) {
    std::shared_ptr<anurbs::BrepLoop>::shared_ptr(&local_58,in_RDX);
    Entry<anurbs::BrepLoop>::create((Entry<anurbs::BrepLoop> *)&local_48,&local_58);
    std::shared_ptr<anurbs::Entry<anurbs::BrepLoop>>::
    shared_ptr<anurbs::Entry<anurbs::BrepLoop>,std::default_delete<anurbs::Entry<anurbs::BrepLoop>>,void>
              ((shared_ptr<anurbs::Entry<anurbs::BrepLoop>> *)local_40,&local_48);
    std::
    unique_ptr<anurbs::Entry<anurbs::BrepLoop>,_std::default_delete<anurbs::Entry<anurbs::BrepLoop>_>_>
    ::~unique_ptr(&local_48);
    std::shared_ptr<anurbs::BrepLoop>::~shared_ptr(&local_58);
    std::static_pointer_cast<anurbs::EntryBase,anurbs::Entry<anurbs::BrepLoop>>(&local_68);
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ::push_back((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                 *)data,(value_type *)&local_68);
    std::shared_ptr<anurbs::EntryBase>::~shared_ptr((shared_ptr<anurbs::EntryBase> *)&local_68);
    sVar2 = std::
            vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
            ::size((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                    *)data);
    local_70 = sVar2 - 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &data[1].super___shared_ptr<anurbs::BrepLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&local_70);
    std::shared_ptr<anurbs::Entry<anurbs::BrepLoop>_>::shared_ptr
              (&local_80,(shared_ptr<anurbs::Entry<anurbs::BrepLoop>_> *)local_40);
    Ref<anurbs::BrepLoop>::Ref((Ref<anurbs::BrepLoop> *)this,&local_80);
    std::shared_ptr<anurbs::Entry<anurbs::BrepLoop>_>::~shared_ptr(&local_80);
    std::shared_ptr<anurbs::Entry<anurbs::BrepLoop>_>::~shared_ptr
              ((shared_ptr<anurbs::Entry<anurbs::BrepLoop>_> *)local_40);
    RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    RVar3.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Ref<anurbs::BrepLoop>)
           RVar3.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::BrepLoop>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Data is null");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Ref<TData> add(Pointer<TData> data)
    {
        if (data == nullptr) {
            throw std::invalid_argument("Data is null");
        }

        Pointer<Entry<TData>> entry = Entry<TData>::create(data);

        m_entries.push_back(std::static_pointer_cast<EntryBase>(entry));

        m_entry_map.push_back(m_entries.size() - 1);

        return Ref<TData>(entry);
    }